

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.cpp
# Opt level: O1

float * __thiscall Colorf::operator[](Colorf *this,int i)

{
  if (i != 0) {
    if (i == 1) {
      return &this->g;
    }
    this = (Colorf *)&this->b;
  }
  return &this->r;
}

Assistant:

float& Colorf::operator[](int i){
	switch (i){
		case 0:
			return r;
		case 1:
			return g;
		default:
			return b;
	}
}